

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void cli::cleanPath(string *path)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  sVar2 = path->_M_string_length;
  pcVar3 = pcVar1;
  if (sVar2 == 0) {
    sVar2 = 0;
    pcVar4 = pcVar1;
  }
  else {
    do {
      if (*pcVar3 == '\\') {
        *pcVar3 = '/';
        pcVar1 = (path->_M_dataplus)._M_p;
        sVar2 = path->_M_string_length;
      }
      pcVar3 = pcVar3 + 1;
      pcVar4 = pcVar1 + sVar2;
    } while (pcVar3 != pcVar4);
  }
  if (pcVar4[-1] == '*') {
    std::__cxx11::string::pop_back();
    pcVar1 = (path->_M_dataplus)._M_p;
    sVar2 = path->_M_string_length;
  }
  if (pcVar1[sVar2 - 1] != '/') {
    return;
  }
  std::__cxx11::string::pop_back();
  return;
}

Assistant:

void cleanPath(std::string &path)
	{
		for (std::string::iterator it = path.begin(); it != path.end(); ++it)
		{
			if ((*it) == '\\')
				(*it) = '/';
		}

		if (path.back() == '*')
			path.pop_back();
		if (path.back() == '/')
			path.pop_back();
	}